

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

void __thiscall QRingBuffer::chop(QRingBuffer *this,qint64 bytes)

{
  QRingChunk *pQVar1;
  long lVar2;
  Data *pDVar3;
  Data *pDVar4;
  bool bVar5;
  long lVar6;
  iterator iVar7;
  
  do {
    if (bytes < 1) {
      return;
    }
    pQVar1 = (this->buffers).d.ptr;
    lVar2 = (this->buffers).d.size;
    lVar6 = pQVar1[lVar2 + -1].tailOffset - pQVar1[lVar2 + -1].headOffset;
    bVar5 = lVar6 <= bytes;
    if (bVar5 && lVar2 != 1) {
      this->bufferSize = this->bufferSize - lVar6;
      pDVar3 = (this->buffers).d.d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
        QArrayDataPointer<QRingChunk>::reallocateAndGrow
                  ((QArrayDataPointer<QRingChunk> *)this,GrowsAtEnd,0,
                   (QArrayDataPointer<QRingChunk> *)0x0);
      }
      QtPrivate::QGenericArrayOps<QRingChunk>::eraseLast((QGenericArrayOps<QRingChunk> *)this);
      bytes = bytes - lVar6;
    }
    else {
      iVar7 = QList<QRingChunk>::end(&this->buffers);
      lVar6 = this->bufferSize - bytes;
      if (lVar6 == 0) {
        if ((((long)this->basicBlockSize < iVar7.i[-1].chunk.d.size) ||
            (pDVar4 = iVar7.i[-1].chunk.d.d, pDVar4 == (Data *)0x0)) ||
           ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> != 1)) {
          clear(this);
        }
        else {
          iVar7.i[-1].headOffset = 0;
          iVar7.i[-1].tailOffset = 0;
          this->bufferSize = 0;
        }
      }
      else {
        iVar7.i[-1].tailOffset = iVar7.i[-1].tailOffset - bytes;
        this->bufferSize = lVar6;
      }
    }
  } while (bVar5 && lVar2 != 1);
  return;
}

Assistant:

void QRingBuffer::chop(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qsizetype chunkSize = buffers.constLast().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.last();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.grow(-bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeLast();
    }
}